

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_writer.cc
# Opt level: O0

bool __thiscall google::protobuf::compiler::ZipWriter::WriteDirectory(ZipWriter *this)

{
  uint32 value;
  uint32 value_00;
  bool bVar1;
  uint16 val;
  uint32 uVar2;
  size_type sVar3;
  reference str;
  reference pvVar4;
  vector<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
  *this_00;
  uint32 dir_len;
  uint32 offset;
  uint32 size;
  uint32 crc32;
  uint16 filename_size;
  string *filename;
  undefined1 local_38 [4];
  int i;
  CodedOutputStream output;
  uint32 dir_ofs;
  uint16 num_entries;
  ZipWriter *this_local;
  
  sVar3 = std::
          vector<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
          ::size(&this->files_);
  output._30_2_ = SUB82(sVar3,0);
  output._24_4_ = (*this->raw_output_->_vptr_ZeroCopyOutputStream[4])();
  io::CodedOutputStream::CodedOutputStream((CodedOutputStream *)local_38,this->raw_output_);
  for (filename._4_4_ = 0; filename._4_4_ < (int)(uint)(ushort)output._30_2_;
      filename._4_4_ = filename._4_4_ + 1) {
    this_00 = &this->files_;
    str = std::
          vector<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
          ::operator[](this_00,(long)filename._4_4_);
    val = std::__cxx11::string::size();
    pvVar4 = std::
             vector<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
             ::operator[](this_00,(long)filename._4_4_);
    uVar2 = pvVar4->crc32;
    pvVar4 = std::
             vector<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
             ::operator[](this_00,(long)filename._4_4_);
    value = pvVar4->size;
    pvVar4 = std::
             vector<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
             ::operator[](this_00,(long)filename._4_4_);
    value_00 = pvVar4->offset;
    io::CodedOutputStream::WriteLittleEndian32((CodedOutputStream *)local_38,0x2014b50);
    WriteShort((CodedOutputStream *)local_38,10);
    WriteShort((CodedOutputStream *)local_38,10);
    WriteShort((CodedOutputStream *)local_38,0);
    WriteShort((CodedOutputStream *)local_38,0);
    WriteShort((CodedOutputStream *)local_38,0);
    WriteShort((CodedOutputStream *)local_38,0);
    io::CodedOutputStream::WriteLittleEndian32((CodedOutputStream *)local_38,uVar2);
    io::CodedOutputStream::WriteLittleEndian32((CodedOutputStream *)local_38,value);
    io::CodedOutputStream::WriteLittleEndian32((CodedOutputStream *)local_38,value);
    WriteShort((CodedOutputStream *)local_38,val);
    WriteShort((CodedOutputStream *)local_38,0);
    WriteShort((CodedOutputStream *)local_38,0);
    WriteShort((CodedOutputStream *)local_38,0);
    WriteShort((CodedOutputStream *)local_38,0);
    io::CodedOutputStream::WriteLittleEndian32((CodedOutputStream *)local_38,0);
    io::CodedOutputStream::WriteLittleEndian32((CodedOutputStream *)local_38,value_00);
    io::CodedOutputStream::WriteString((CodedOutputStream *)local_38,&str->name);
  }
  uVar2 = io::CodedOutputStream::ByteCount((CodedOutputStream *)local_38);
  io::CodedOutputStream::WriteLittleEndian32((CodedOutputStream *)local_38,0x6054b50);
  WriteShort((CodedOutputStream *)local_38,0);
  WriteShort((CodedOutputStream *)local_38,0);
  WriteShort((CodedOutputStream *)local_38,output._30_2_);
  WriteShort((CodedOutputStream *)local_38,output._30_2_);
  io::CodedOutputStream::WriteLittleEndian32((CodedOutputStream *)local_38,uVar2);
  io::CodedOutputStream::WriteLittleEndian32((CodedOutputStream *)local_38,output._24_4_);
  WriteShort((CodedOutputStream *)local_38,0);
  bVar1 = io::CodedOutputStream::HadError((CodedOutputStream *)local_38);
  io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_38);
  return bVar1;
}

Assistant:

bool ZipWriter::WriteDirectory() {
  uint16 num_entries = files_.size();
  uint32 dir_ofs = raw_output_->ByteCount();

  // write central directory
  io::CodedOutputStream output(raw_output_);
  for (int i = 0; i < num_entries; ++i) {
    const string &filename = files_[i].name;
    uint16 filename_size = filename.size();
    uint32 crc32 = files_[i].crc32;
    uint32 size = files_[i].size;
    uint32 offset = files_[i].offset;

    output.WriteLittleEndian32(0x02014b50);  // magic
    WriteShort(&output, 10);  // version made by
    WriteShort(&output, 10);  // version needed to extract
    WriteShort(&output, 0);  // flags
    WriteShort(&output, 0);  // compression method: stored
    WriteShort(&output, 0);  // last modified time
    WriteShort(&output, 0);  // last modified date
    output.WriteLittleEndian32(crc32);  // crc-32
    output.WriteLittleEndian32(size);  // compressed size
    output.WriteLittleEndian32(size);  // uncompressed size
    WriteShort(&output, filename_size);  // file name length
    WriteShort(&output, 0);   // extra field length
    WriteShort(&output, 0);   // file comment length
    WriteShort(&output, 0);   // starting disk number
    WriteShort(&output, 0);   // internal file attributes
    output.WriteLittleEndian32(0);  // external file attributes
    output.WriteLittleEndian32(offset);  // local header offset
    output.WriteString(filename);  // file name
  }
  uint32 dir_len = output.ByteCount();

  // write end of central directory marker
  output.WriteLittleEndian32(0x06054b50);  // magic
  WriteShort(&output, 0);  // disk number
  WriteShort(&output, 0);  // disk with start of central directory
  WriteShort(&output, num_entries);  // central directory entries (this disk)
  WriteShort(&output, num_entries);  // central directory entries (total)
  output.WriteLittleEndian32(dir_len);  // central directory byte size
  output.WriteLittleEndian32(dir_ofs);  // central directory offset
  WriteShort(&output, 0);   // comment length

  return output.HadError();
}